

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcReadVer.c
# Opt level: O0

char * Wlc_PrsConvertInitValues(Wlc_Ntk_t *p)

{
  Vec_Int_t *p_00;
  int iVar1;
  Vec_Str_t *p_01;
  char *pcVar2;
  int local_7c;
  char local_6c;
  uint *local_58;
  Vec_Str_t *vStr;
  char *pResult;
  int *pInits;
  int local_20;
  int Value;
  int k;
  int i;
  Wlc_Obj_t *pObj;
  Wlc_Ntk_t *p_local;
  
  p_01 = Vec_StrAlloc(1000);
  for (Value = 0; iVar1 = Vec_IntSize(p->vInits), Value < iVar1; Value = Value + 1) {
    iVar1 = Vec_IntEntry(p->vInits,Value);
    if (iVar1 < 0) {
      for (local_20 = 0; SBORROW4(local_20,-iVar1) != local_20 + iVar1 < 0; local_20 = local_20 + 1)
      {
        Vec_StrPush(p_01,'0');
      }
    }
    else {
      _k = Wlc_NtkObj(p,iVar1);
      local_7c = Wlc_ObjRange(_k);
      while ((undefined1  [24])((undefined1  [24])*_k & (undefined1  [24])0x3f) ==
             (undefined1  [24])0x7) {
        iVar1 = Wlc_ObjFaninId0(_k);
        _k = Wlc_NtkObj(p,iVar1);
      }
      if ((undefined1  [24])((undefined1  [24])*_k & (undefined1  [24])0x3f) ==
          (undefined1  [24])0x6) {
        local_58 = (uint *)Wlc_ObjConstValue(_k);
      }
      else {
        local_58 = (uint *)0x0;
      }
      local_20 = 0;
      while( true ) {
        iVar1 = Wlc_ObjRange(_k);
        iVar1 = Abc_MinInt(local_7c,iVar1);
        if (iVar1 <= local_20) break;
        if (local_58 == (uint *)0x0) {
          local_6c = 'X';
        }
        else {
          iVar1 = Abc_InfoHasBit(local_58,local_20);
          local_6c = (char)iVar1 + '0';
        }
        Vec_StrPush(p_01,local_6c);
        local_20 = local_20 + 1;
      }
      for (; local_20 < local_7c; local_20 = local_20 + 1) {
        Vec_StrPush(p_01,'0');
      }
      p_00 = p->vInits;
      if (local_58 == (uint *)0x0) {
        local_7c = Wlc_ObjCiId(_k);
      }
      else {
        local_7c = -local_7c;
      }
      Vec_IntWriteEntry(p_00,Value,local_7c);
    }
  }
  Vec_StrPush(p_01,'\0');
  pcVar2 = Vec_StrReleaseArray(p_01);
  Vec_StrFree(p_01);
  return pcVar2;
}

Assistant:

char * Wlc_PrsConvertInitValues( Wlc_Ntk_t * p )
{
    Wlc_Obj_t * pObj; 
    int i, k, Value, * pInits;
    char * pResult;
    Vec_Str_t * vStr = Vec_StrAlloc( 1000 );
    Vec_IntForEachEntry( p->vInits, Value, i )
    {
        if ( Value < 0 )
        {
            for ( k = 0; k < -Value; k++ )
                Vec_StrPush( vStr, '0' );
            continue;
        }
        pObj = Wlc_NtkObj( p, Value );
        Value = Wlc_ObjRange(pObj);
        while ( pObj->Type == WLC_OBJ_BUF )
            pObj = Wlc_NtkObj( p, Wlc_ObjFaninId0(pObj) );
        pInits = pObj->Type == WLC_OBJ_CONST ? Wlc_ObjConstValue(pObj) : NULL;
        for ( k = 0; k < Abc_MinInt(Value, Wlc_ObjRange(pObj)); k++ )
            Vec_StrPush( vStr, (char)(pInits ? '0' + Abc_InfoHasBit((unsigned *)pInits, k) : 'X') );
        // extend values with zero, in case the init value signal has different range compared to constant used
        for ( ; k < Value; k++ )
            Vec_StrPush( vStr, '0' );
        // update vInits to contain either number of values or PI index
        Vec_IntWriteEntry( p->vInits, i, pInits ? -Value : Wlc_ObjCiId(pObj) );
    }
    Vec_StrPush( vStr, '\0' );
    pResult = Vec_StrReleaseArray( vStr );
    Vec_StrFree( vStr );
    return pResult;
}